

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O2

void __thiscall
google::protobuf::io::Printer::Sub::Sub<std::__cxx11::string>
          (Sub *this,string *key,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  std::__cxx11::string::string((string *)this,(string *)key);
  ValueImpl<true>::ValueImpl<std::__cxx11::string,void>(&this->value_,value);
  (this->annotation_).
  super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>._M_payload.
  super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>.
  super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged = false;
  return;
}

Assistant:

Sub(std::string key, Value&& value)
      : key_(std::move(key)),
        value_(std::forward<Value>(value)),
        annotation_(absl::nullopt) {}